

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.hpp
# Opt level: O0

double __thiscall MetaSim::ParetoVar::getMinimum(ParetoVar *this)

{
  undefined8 uVar1;
  string *in_stack_00000018;
  MaxException *in_stack_00000020;
  allocator local_29;
  string local_28 [40];
  
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"ExponentialVar",&local_29);
  RandomVar::MaxException::MaxException(in_stack_00000020,in_stack_00000018);
  __cxa_throw(uVar1,&RandomVar::MaxException::typeinfo,RandomVar::MaxException::~MaxException);
}

Assistant:

virtual double getMinimum() throw(MaxException)
            {throw MaxException("ExponentialVar");}